

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void getSortedOption(TidyDoc tdoc,AllOption_t *tOption)

{
  TidyOption p_Var1;
  TidyOption topt;
  TidyIterator p_Stack_20;
  uint i;
  TidyIterator pos;
  AllOption_t *tOption_local;
  TidyDoc tdoc_local;
  
  pos = (TidyIterator)tOption;
  tOption_local = (AllOption_t *)tdoc;
  p_Stack_20 = tidyGetOptionList(tdoc);
  topt._4_4_ = 0;
  while (p_Stack_20 != (TidyIterator)0x0) {
    p_Var1 = tidyGetNextOption((TidyDoc)tOption_local,&stack0xffffffffffffffe0);
    *(TidyOption *)(pos + (ulong)topt._4_4_ * 2) = p_Var1;
    topt._4_4_ = topt._4_4_ + 1;
  }
  *(undefined8 *)(pos + (ulong)topt._4_4_ * 2) = 0;
  qsort(pos,(ulong)topt._4_4_,8,cmpOpt);
  return;
}

Assistant:

static void getSortedOption(TidyDoc tdoc,         /**< The Tidy document. */
                            AllOption_t *tOption  /**< [out] The list of options. */
                            )
{
    TidyIterator pos = tidyGetOptionList( tdoc );
    uint i = 0;

    while ( pos )
    {
        TidyOption topt = tidyGetNextOption( tdoc, &pos );
        tOption->topt[i] = topt;
        ++i;
    }
    tOption->topt[i] = NULL; /* sentinel */

    qsort(tOption->topt,
          i, /* there are i items, not including the sentinal */
          sizeof(tOption->topt[0]),
          cmpOpt);
}